

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::PathBuilderCheckPathAfterVerificationTest_SetsDelegateData_Test::TestBody
          (PathBuilderCheckPathAfterVerificationTest_SetsDelegateData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  CertPathBuilderResultPath *pCVar3;
  char *in_R9;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  DelegateData *data;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  shared_ptr<const_bssl::ParsedCertificate> local_68;
  undefined1 local_58 [8];
  Result result;
  SetsDelegateDataPathBuilderDelegate delegate;
  PathBuilderCheckPathAfterVerificationTest_SetsDelegateData_Test *this_local;
  
  SetsDelegateDataPathBuilderDelegate::SetsDelegateDataPathBuilderDelegate
            ((SetsDelegateDataPathBuilderDelegate *)&result.exceeded_iteration_limit);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr(&local_68,(nullptr_t)0x0);
  PathBuilderSimpleChainTest::RunPathBuilder
            ((Result *)local_58,(PathBuilderSimpleChainTest *)this,&local_68,
             (CertPathBuilderDelegate *)&result.exceeded_iteration_limit);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_68);
  local_89 = CertPathBuilder::Result::HasValidPath((Result *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,(AssertionResult *)"result.HasValidPath()","false",
               "true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x989,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (bVar1) {
    pCVar3 = CertPathBuilder::Result::GetBestValidPath((Result *)local_58);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )::std::
           unique_ptr<bssl::CertPathBuilderDelegateData,_std::default_delete<bssl::CertPathBuilderDelegateData>_>
           ::get(&pCVar3->delegate_data);
    local_e4 = 0xb33f;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_e0,"0xB33F","data->value",&local_e4,
               (int *)((long)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x98e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  }
  CertPathBuilder::Result::~Result((Result *)local_58);
  SetsDelegateDataPathBuilderDelegate::~SetsDelegateDataPathBuilderDelegate
            ((SetsDelegateDataPathBuilderDelegate *)&result.exceeded_iteration_limit);
  return;
}

Assistant:

TEST_F(PathBuilderCheckPathAfterVerificationTest, SetsDelegateData) {
  SetsDelegateDataPathBuilderDelegate delegate;
  CertPathBuilder::Result result = RunPathBuilder(nullptr, &delegate);
  ASSERT_TRUE(result.HasValidPath());

  DelegateData *data = reinterpret_cast<DelegateData *>(
      result.GetBestValidPath()->delegate_data.get());

  EXPECT_EQ(0xB33F, data->value);
}